

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
getMomentaDotFromForces(IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u)

{
  Index *pIVar1;
  _func_int **pp_Var2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  undefined1 auVar7 [16];
  uint k;
  double *pdVar8;
  Index IVar9;
  Index IVar10;
  double *pdVar11;
  _func_int *p_Var12;
  IMUElasticLocalFrameDynamicalSystem *pIVar13;
  undefined8 uVar14;
  char cVar15;
  PointerType ptr;
  reference pMVar16;
  _func_int **pp_Var17;
  undefined8 *puVar18;
  long *in_RCX;
  char *__function;
  long lVar19;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar20;
  ActualDstType actualDst_3;
  long lVar21;
  ActualDstType actualDst_2;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dd;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  Vector VVar33;
  assign_op<double,_double> local_141;
  IndexedMatrixArray *local_140;
  undefined1 local_138 [16];
  DstXprType local_128;
  IMUElasticLocalFrameDynamicalSystem *local_e8;
  long *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  Vector3 *local_b0;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_98;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_78;
  DstEvaluatorType dstEvaluator_2;
  SrcEvaluatorType srcEvaluator;
  
  cVar15 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar15 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x42,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  local_e0 = in_RCX;
  cVar15 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[9])(x);
  if (cVar15 == '\0') {
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x47,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  if (2 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar6 = pdVar5[1];
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)*pdVar5;
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar6;
    x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pdVar5[2];
    if (5 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar4 = (double *)pdVar5[4];
      x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar5[3];
      x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar4;
      pdVar5 = (double *)pdVar5[5];
      uVar25 = 0;
      uVar26 = 0;
      x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar5;
      pdVar4 = x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pIVar1 = &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
      if (((((double)pdVar4 != (double)*pIVar1) || (NAN((double)pdVar4) || NAN((double)*pIVar1))) ||
          (dVar6 = (double)x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows,
          dVar6 != (double)x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data)) ||
         (NAN(dVar6) ||
          NAN((double)x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data))) {
LAB_0015065b:
        pdVar4 = (double *)
                 x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        pdVar8 = x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar4;
        x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pdVar8;
        x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar5;
        dVar6 = (double)pdVar5 * (double)pdVar5 +
                (double)pdVar8 * (double)pdVar8 + (double)pdVar4 * (double)pdVar4;
        local_140 = (IndexedMatrixArray *)&DAT_3ff0000000000000;
        if (dVar6 <= 9.999999999999999e-33) {
          local_138 = ZEXT816(0);
          dVar6 = 0.0;
          uVar25 = 0;
          uVar26 = 0;
        }
        else {
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
            uVar25 = extraout_XMM0_Dc;
            uVar26 = extraout_XMM0_Dd;
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          auVar7._8_8_ = dVar6;
          auVar7._0_8_ = dVar6;
          local_138 = divpd(*(undefined1 (*) [16])
                             &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,auVar7);
          local_140 = (IndexedMatrixArray *)
                      ((double)x[0x4f].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows / dVar6);
        }
        local_d8._8_4_ = uVar25;
        local_d8._0_8_ = dVar6;
        local_d8._12_4_ = uVar26;
        dVar6 = sin(dVar6);
        local_e8 = (IMUElasticLocalFrameDynamicalSystem *)((double)local_140 * dVar6);
        local_c8._8_4_ = SUB84(dVar6 * (double)local_138._8_8_,0);
        local_c8._0_8_ = dVar6 * (double)local_138._0_8_;
        local_c8._12_4_ = (int)((ulong)(dVar6 * (double)local_138._8_8_) >> 0x20);
        dVar6 = cos((double)local_d8._0_8_);
        dVar31 = 1.0 - dVar6;
        dVar32 = dVar31 * (double)local_138._0_8_;
        dVar30 = (double)local_140 * dVar31 * (double)local_138._8_8_;
        x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)((double)local_138._0_8_ * dVar32 + dVar6);
        x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)((double)local_138._8_8_ * dVar32 + (double)local_e8);
        x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)((double)local_140 * dVar32 - (double)local_c8._8_8_);
        x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)((double)local_138._8_8_ * dVar32 - (double)local_e8);
        x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)(dVar31 * (double)local_138._8_8_ * (double)local_138._8_8_ + dVar6);
        x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)(dVar30 + (double)local_c8._0_8_);
        x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)((double)local_c8._8_8_ + (double)local_140 * dVar32);
        x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)(dVar30 - (double)local_c8._0_8_);
        x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)((double)local_140 * dVar31 * (double)local_140 + dVar6);
      }
      else {
        pdVar4 = x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        if (((double)pdVar4 != (double)pdVar5) || (NAN((double)pdVar4) || NAN((double)pdVar5)))
        goto LAB_0015065b;
      }
      local_138._0_8_ = u;
      local_d8._0_8_ = x + 0x4a;
      actualDst = (ActualDstType)
                  &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows;
      pdVar5 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar20 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      pdVar4 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar9 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar8 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar10 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      pdVar11 = x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar5;
      x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar20;
      x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar4;
      x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar9;
      x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar8;
      x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar10;
      x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar11;
      x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar23 = 0xc;
      uVar22 = 0;
      lVar21 = 0x60;
      local_e8 = this;
      do {
        local_128.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.m_data =
             (PointerType)
             ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_138._0_8_)->
                    m_storage).m_data.array[0] + lVar21);
        local_128.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        m_outerStride =
             (Index)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_138._0_8_)->
                    m_storage).m_data.array[1];
        local_128.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.m_rows.
        m_value = 6;
        local_128.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)local_138._0_8_;
        local_128.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_startRow
        .m_value = lVar23;
        if (local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_outerStride + -6 < lVar23) goto LAB_0015126c;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_98,
                   (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_128);
        IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xc1),(Matrix *)&local_98,uVar22);
        free(local_98.m_dst);
        lVar23 = lVar23 + 6;
        uVar22 = uVar22 + 1;
        lVar21 = lVar21 + 0x30;
      } while (lVar23 == 0x12);
      if (0x1a < *(long *)(local_138._0_8_ + 8)) {
        lVar21 = *(long *)local_138._0_8_;
        IVar20 = *(Index *)(lVar21 + 200);
        x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             *(double **)(lVar21 + 0xc0);
        x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             IVar20;
        x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             *(double **)(lVar21 + 0xd0);
        if (0x1d < *(long *)(local_138._0_8_ + 8)) {
          lVar21 = *(long *)local_138._0_8_;
          actualDst_1 = (ActualDstType)
                        &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
          pdVar5 = *(double **)(lVar21 + 0xe0);
          x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               *(Index *)(lVar21 + 0xd8);
          x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               pdVar5;
          x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               *(Index *)(lVar21 + 0xe8);
          pIVar1 = &x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows;
          lVar21 = 0;
          uVar24 = 0;
          do {
            pdVar5 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar23 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar5 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar5 == (double *)0x0)) * 0x15;
            if (lVar23 == 0) {
LAB_0015124d:
              __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                            ,0x9b,
                            "void stateObservation::IndexedMatrixArray::check_(unsigned int) const")
              ;
            }
            uVar22 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar24 < uVar22) || (lVar23 + (ulong)uVar22 <= uVar24)) goto LAB_0015124d;
            pMVar16 = std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)pIVar1,(ulong)((int)uVar24 - uVar22));
            if (((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows < 3) ||
               ((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols < 1)) {
LAB_00151285:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                           );
            }
            if ((long)x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + -3 < lVar21) {
LAB_001512a6:
              __function = 
              "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
              ;
              goto LAB_001512d4;
            }
            pdVar4 = (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
            lVar23 = x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            dVar6 = pdVar4[1];
            pdVar5 = (double *)(lVar23 + lVar21 * 8);
            *pdVar5 = *pdVar4;
            pdVar5[1] = dVar6;
            *(double *)(lVar23 + 0x10 + lVar21 * 8) = pdVar4[2];
            pdVar5 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar23 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar5 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar5 == (double *)0x0)) * 0x15;
            if (lVar23 == 0) goto LAB_0015124d;
            uVar22 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar24 < uVar22) || (lVar23 + (ulong)uVar22 <= uVar24)) goto LAB_0015124d;
            pMVar16 = std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)pIVar1,(ulong)((int)uVar24 - uVar22));
            if (((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows < 6) ||
               ((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols < 1)) goto LAB_00151285;
            if ((long)x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + -3 < lVar21) goto LAB_001512a6;
            pdVar4 = (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
            lVar23 = x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            dVar6 = pdVar4[4];
            pdVar5 = (double *)(lVar23 + lVar21 * 8);
            *pdVar5 = pdVar4[3];
            pdVar5[1] = dVar6;
            *(double *)(lVar23 + 0x10 + lVar21 * 8) = pdVar4[5];
            uVar24 = uVar24 + 1;
            lVar21 = lVar21 + 3;
          } while (uVar24 == 1);
          if (0x1f < *(long *)(local_138._0_8_ + 8)) {
            srcEvaluator.
            super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data = (PointerType)(*(long *)local_138._0_8_ + 0xf0);
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_data = (PointerType)(x + 0x53);
            local_78.m_row = 0;
            local_78.m_col = 1;
            local_78.m_currentBlockRows = 2;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_rows.m_value = 2;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_cols.m_value = 1;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_startRow.m_value = 0;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_startCol.m_value = 0;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_outerStride = 3;
            local_98.m_src = &srcEvaluator;
            local_98.m_dst = &dstEvaluator_2;
            local_98.m_functor = &local_141;
            local_98.m_dstExpr = &local_128;
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_xpr =
                 (XprTypeNested)
                 local_128.
                 super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                 .m_data;
            local_78.m_xpr =
                 (Matrix<double,_3,_1,_0,_3,_1> *)
                 local_128.
                 super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                 .m_data;
            dstEvaluator_2.
            super_block_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>_>
            .m_data = local_128.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_data;
            srcEvaluator.
            super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_outerStride.m_value = *(long *)(local_138._0_8_ + 8);
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run(&local_98);
            local_128.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_data = (PointerType)0x0;
            Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_78,(Scalar *)&local_128);
            if ((local_78.m_currentBlockRows + local_78.m_row != 3) || (local_78.m_col != 1)) {
              __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                            ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                           );
            }
            if (2 < local_e0[1]) {
              pdVar5 = (double *)*local_e0;
              dVar30 = *pdVar5;
              pdVar4 = (double *)pdVar5[1];
              x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)dVar30;
              x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar4;
              dVar6 = pdVar5[2];
              x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)dVar6;
              if (*(char *)((long)&x[0x43].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows + 5) != '\0') {
                dVar31 = (double)x[0x53].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows;
                x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dVar30 - (double)x[0x53].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)((double)pdVar4 - dVar31);
                x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dVar6 - (double)x[0x54].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_data);
              }
              uVar24 = CONCAT44(0,*(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4));
              local_138._0_8_ = uVar24;
              local_b0 = (Vector3 *)(x + 0xcb);
              if (uVar24 != 0) {
                local_140 = (IndexedMatrixArray *)(x + 0xa2);
                local_c8._0_8_ =
                     &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
                uVar22 = 0x30;
                lVar21 = 0;
                do {
                  k = (uint)lVar21;
                  uVar24 = (ulong)(k * 0xc + 0x30);
                  if (local_e0[1] + -3 < (long)uVar24) goto LAB_001512bf;
                  lVar23 = *local_e0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data = (PointerType)0x0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_rows.m_value = 0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_cols.m_value = 0;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,3,3,1);
                  if ((local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_rows.m_value != 3) ||
                     (local_128.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_cols.m_value != 1)) {
                    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                              ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,3,3,1);
                  }
                  if ((local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_rows.m_value != 3) ||
                     (local_128.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_cols.m_value != 1)) {
LAB_001512e0:
                    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>, T1 = double, T2 = double]"
                                 );
                  }
                  pdVar5 = (double *)(lVar23 + uVar24 * 8);
                  dVar6 = pdVar5[1];
                  *local_128.
                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                   .m_data = *pdVar5;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[1] = dVar6;
                  lVar19 = 2;
                  do {
                    local_128.
                    super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                    .m_data[lVar19] = *(double *)(lVar23 + (ulong)uVar22 * 8 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  IndexedMatrixArray::setValue(local_140,(Matrix *)&local_128,k);
                  free(local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_data);
                  uVar24 = (ulong)(k * 0xc + 0x33);
                  if (local_e0[1] + -3 < (long)uVar24) goto LAB_001512bf;
                  lVar23 = *local_e0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data = (PointerType)0x0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_rows.m_value = 0;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_cols.m_value = 0;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,3,3,1);
                  if ((local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_rows.m_value != 3) ||
                     (local_128.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_cols.m_value != 1)) {
                    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                              ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,3,3,1);
                  }
                  if ((local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_rows.m_value != 3) ||
                     (local_128.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_cols.m_value != 1)) goto LAB_001512e0;
                  pdVar5 = (double *)(lVar23 + uVar24 * 8);
                  dVar6 = pdVar5[1];
                  *local_128.
                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                   .m_data = *pdVar5;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[1] = dVar6;
                  lVar19 = 0;
                  do {
                    local_128.
                    super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                    .m_data[lVar19 + 2] =
                         *(double *)((ulong)uVar22 * 8 + lVar23 + 0x28 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 1);
                  IndexedMatrixArray::setValue
                            ((IndexedMatrixArray *)local_c8._0_8_,(Matrix *)&local_128,k);
                  free(local_128.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_data);
                  lVar21 = lVar21 + 1;
                  uVar22 = uVar22 + 0xc;
                } while (lVar21 != local_138._0_8_);
              }
              pIVar13 = local_e8;
              if (0x2c < local_e0[1]) {
                lVar21 = *local_e0;
                pdVar5 = *(double **)(lVar21 + 0x158);
                x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = *(Index *)(lVar21 + 0x150);
                x[0xf1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar5;
                x[0xf1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = *(Index *)(lVar21 + 0x160);
                uVar14 = local_d8._0_8_;
                if (0x2f < local_e0[1]) {
                  lVar21 = *local_e0;
                  IVar20 = *(Index *)(lVar21 + 0x170);
                  x[0xf2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = *(double **)(lVar21 + 0x168);
                  x[0xf2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = IVar20;
                  x[0xf3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = *(double **)(lVar21 + 0x178);
                  computeContactWrench
                            ((IMUElasticLocalFrameDynamicalSystem *)x,actualDst,
                             (Vector3 *)local_d8._0_8_,(IndexedMatrixArray *)(x + 0xa2),
                             (IndexedMatrixArray *)
                             &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,
                             (Vector *)
                             &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,
                             (Vector *)
                             &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,local_b0,actualDst_1,
                             (Vector3 *)
                             &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,(Vector3 *)(x + 0xf2));
                  pdVar5 = cst::gravity;
                  if (DAT_001928d8 < 0) {
                    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  if (DAT_001928d8 != 3) {
                    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 3, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                                 );
                  }
                  pdVar4 = x[199].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar6 = cst::gravity[1];
                  x[0x47].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           ((double)x[0xc6].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows - *cst::gravity * 56.8);
                  x[0x47].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)((double)pdVar4 - dVar6 * 56.8);
                  x[0x48].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           (pdVar5[2] * -56.8 +
                           (double)x[199].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows);
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_rows.m_value =
                       (long)&local_128.
                              super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                              .
                              super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                              .m_cols;
                  dVar6 = (double)x[0x8e].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows;
                  pdVar4 = x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar30 = (double)x[0x8f].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_cols.m_value =
                       (long)(dVar30 * (double)x[0x57].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows +
                             (double)pdVar4 *
                             (double)x[0x56].
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data +
                             (double)x[0x54].
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows * dVar6);
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  m_xpr = (XprTypeNested)
                          (dVar30 * (double)x[0x58].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data +
                          (double)pdVar4 *
                          (double)x[0x56].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows +
                          (double)x[0x55].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data * dVar6);
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  m_startRow.m_value =
                       (long)(dVar30 * (double)x[0x58].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows +
                              (double)pdVar4 *
                              (double)x[0x57].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data +
                             dVar6 * (double)x[0x55].
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_rows);
                  local_128.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  m_startCol.m_value = uVar14;
                  dVar27 = (double)local_128.
                                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                                   .
                                   super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                                   .
                                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                                   .
                                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                                   .m_cols.m_value +
                           (double)x[0x4a].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data;
                  dVar28 = (double)local_128.
                                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                                   .
                                   super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                                   .m_xpr +
                           (double)x[0x4a].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  dVar29 = (double)local_128.
                                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                                   .
                                   super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                                   .m_startRow.m_value +
                           (double)x[0x4b].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data;
                  dVar6 = (double)x[0xca].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows;
                  pdVar4 = x[0xca].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar30 = *pdVar5;
                  dVar31 = pdVar5[1];
                  dVar32 = pdVar5[2];
                  x[0x48].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)((double)x[0xc9].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows -
                                  (dVar32 * dVar28 * 56.8 + dVar31 * dVar29 * -56.8 + dVar30 * 0.0))
                  ;
                  x[0x49].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           ((double)pdVar4 -
                           (dVar32 * -dVar27 * 56.8 + dVar31 * 0.0 + dVar30 * dVar29 * 56.8));
                  x[0x49].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)(dVar6 - (dVar32 * 0.0 + dVar27 * 56.8 * dVar31 +
                                           dVar28 * -56.8 * dVar30));
                  (pIVar13->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                       (_func_int **)0x0;
                  *(undefined8 *)&pIVar13->printed_ = 0;
                  IVar20 = extraout_RDX;
                  if (*(long *)&pIVar13->printed_ != 6) {
                    free((pIVar13->super_DynamicalSystemFunctorBase).
                         _vptr_DynamicalSystemFunctorBase);
                    pp_Var17 = (_func_int **)malloc(0x30);
                    if (((ulong)pp_Var17 & 0xf) != 0) {
                      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                                    "void *Eigen::internal::aligned_malloc(std::size_t)");
                    }
                    if (pp_Var17 == (_func_int **)0x0) {
                      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar18 = std::ios::widen;
                      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                    }
                    (pIVar13->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                         pp_Var17;
                    IVar20 = extraout_RDX_00;
                  }
                  *(undefined8 *)&pIVar13->printed_ = 6;
                  pp_Var17 = (pIVar13->super_DynamicalSystemFunctorBase).
                             _vptr_DynamicalSystemFunctorBase;
                  uVar24 = 0xfffffffffffffffe;
                  do {
                    ppdVar3 = &x[0x48].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data + uVar24;
                    p_Var12 = (_func_int *)ppdVar3[1];
                    pp_Var2 = pp_Var17 + uVar24 + 2;
                    *pp_Var2 = (_func_int *)*ppdVar3;
                    pp_Var2[1] = p_Var12;
                    uVar24 = uVar24 + 2;
                  } while (uVar24 < 4);
                  VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = IVar20;
                  VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)pIVar13;
                  return (Vector)VVar33.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage;
                }
              }
            }
LAB_001512bf:
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_001512d4;
          }
        }
      }
    }
  }
LAB_0015126c:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001512d4:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromForces(const Vector& x, const Vector& u)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        // Getting flexibility
        op_.positionFlex=x.segment(state::pos,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.rFlex = computeRotation_(op_.orientationFlexV,0);

        // Getting contact forces
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts.setValue(x.segment(state::fc+6*i,6),i);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        // Getting CoM
        op_.positionComBias <<  x.segment(state::comBias,2),
                                0;// the bias of the com along the z axis is assumed 0.
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;


        // Getting contact positions
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
          // Positions
          op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
          op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        computeContactWrench(op_.rFlex, op_.positionFlex, op_.contactPosV, op_.contactOriV,
                             fc_, tc_, op_.fm, op_.tm, op_.addForce, op_.addMoment);


        op_.momentaDot.segment<3>(0) = op_.f - hrp2::m*cst::gravity;
        op_.momentaDot.segment<3>(3) = op_.t - kine::skewSymmetric(op_.rFlex*op_.positionCom+op_.positionFlex)*hrp2::m*cst::gravity;

        return op_.momentaDot;
    }